

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacketbuilder.cpp
# Opt level: O0

int __thiscall jrtplib::RTPPacketBuilder::Init(RTPPacketBuilder *this,size_t max)

{
  RTPMemoryManager *mgr;
  uint8_t *puVar1;
  size_t max_local;
  RTPPacketBuilder *this_local;
  
  if ((this->init & 1U) == 0) {
    if (max == 0) {
      this_local._4_4_ = -0x13;
    }
    else {
      this->maxpacksize = max;
      mgr = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
      puVar1 = (uint8_t *)operator_new__(max,mgr,9);
      this->buffer = puVar1;
      if (this->buffer == (uint8_t *)0x0) {
        this_local._4_4_ = -1;
      }
      else {
        this->packetlength = 0;
        CreateNewSSRC(this);
        this->deftsset = false;
        this->defptset = false;
        this->defmarkset = false;
        this->numcsrcs = 0;
        this->init = true;
        this_local._4_4_ = 0;
      }
    }
  }
  else {
    this_local._4_4_ = -0xc;
  }
  return this_local._4_4_;
}

Assistant:

int RTPPacketBuilder::Init(size_t max)
{
	if (init)
		return ERR_RTP_PACKBUILD_ALREADYINIT;
	if (max <= 0)
		return ERR_RTP_PACKBUILD_INVALIDMAXPACKETSIZE;
	
	maxpacksize = max;
	buffer = RTPNew(GetMemoryManager(),RTPMEM_TYPE_BUFFER_RTPPACKETBUILDERBUFFER) uint8_t [max];
	if (buffer == 0)
		return ERR_RTP_OUTOFMEM;
	packetlength = 0;
	
	CreateNewSSRC();

	deftsset = false;
	defptset = false;
	defmarkset = false;
		
	numcsrcs = 0;
	
	init = true;
	return 0;
}